

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::LineRenderCase::verifyRenderResult
          (LineRenderCase *this,IterationConfig *config)

{
  IVec2 *viewportSize;
  ostringstream *poVar1;
  int iVar2;
  int iVar3;
  TypedObjectWrapper<(glu::ObjectType)3> *pTVar4;
  RenderContext *context;
  QueryDirection QVar5;
  IterationConfig *pIVar6;
  bool bVar7;
  byte bVar8;
  byte bVar9;
  int iVar10;
  QueryDirection QVar11;
  undefined4 extraout_var;
  RenderTarget *pRVar12;
  TestLog *pTVar13;
  size_t __n;
  ConstPixelBufferAccess *pCVar14;
  void *__buf;
  void *__buf_00;
  char *description;
  void *__buf_01;
  void *__buf_02;
  QueryDirection QVar15;
  qpTestResult testResult;
  char *pcVar16;
  LineRenderCase *this_00;
  QueryDirection QVar17;
  qpTestResult qVar18;
  float size;
  allocator<char> local_3e8;
  allocator<char> local_3e7;
  allocator<char> local_3e6;
  allocator<char> local_3e5;
  QueryDirection local_3e4;
  LineRenderCase *local_3e0;
  QueryDirection local_3d8;
  QueryDirection local_3d4;
  int local_3d0;
  int messageLimitCounter;
  IterationConfig *local_3c8;
  int local_3bc;
  int local_3b8;
  int local_3b4;
  int local_3b0;
  int local_3ac;
  int local_3a8;
  int local_3a4;
  int local_3a0;
  int local_39c;
  int local_398;
  int local_394;
  ulong local_390;
  IVec4 viewportPatternArea;
  IVec2 expectedVerticalLines;
  IVec2 expectedHorizontalLines;
  Surface viewportSurface;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350 [4];
  IVec4 viewportBBoxArea;
  ProjectedBBox projectedBBox;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  LogImage local_268;
  ConstPixelBufferAccess local_1d8;
  MessageBuilder local_1b0;
  
  iVar10 = (*((this->super_BBoxRenderCase).super_TestCase.m_context)->m_renderCtx->
             _vptr_RenderContext[3])();
  pRVar12 = Context::getRenderTarget((this->super_BBoxRenderCase).super_TestCase.m_context);
  local_394 = pRVar12->m_numSamples;
  local_3c8 = config;
  projectBoundingBox(&projectedBBox,&config->bbox);
  pIVar6 = local_3c8;
  if (this->m_isWideLineCase == false) {
    size = 1.0;
  }
  else {
    size = (float)this->m_wideLineLineWidth;
  }
  viewportSize = &local_3c8->viewportSize;
  local_390 = CONCAT44(extraout_var,iVar10);
  getViewportBoundingBoxArea((anon_unknown_1 *)&viewportBBoxArea,&projectedBBox,viewportSize,size);
  BBoxRenderCase::getViewportPatternArea
            ((BBoxRenderCase *)&viewportPatternArea,&pIVar6->patternPos,&pIVar6->patternSize,
             viewportSize,ROUND_INWARDS);
  iVar2 = viewportBBoxArea.m_data[3];
  local_3e4 = viewportBBoxArea.m_data[1];
  QVar17 = (pIVar6->viewportSize).m_data[1];
  getNumberOfLinesRange
            ((LineRenderCase *)&expectedHorizontalLines,(int)this,viewportBBoxArea.m_data[1],
             (pIVar6->patternPos).m_data[1],(pIVar6->patternSize).m_data[1],
             viewportBBoxArea.m_data[3],QVar17);
  iVar10 = viewportBBoxArea.m_data[2];
  QVar15 = viewportBBoxArea.m_data[0];
  QVar11 = (pIVar6->viewportSize).m_data[0];
  local_3e0 = this;
  getNumberOfLinesRange
            ((LineRenderCase *)&expectedVerticalLines,(int)this,viewportBBoxArea.m_data[0],
             (pIVar6->patternPos).m_data[0],(pIVar6->patternSize).m_data[0],
             viewportBBoxArea.m_data[2],QVar11);
  if ((int)QVar15 < 1) {
    QVar15 = DIRECTION_HORIZONTAL;
  }
  local_3d8 = DIRECTION_HORIZONTAL;
  if (0 < (int)local_3e4) {
    local_3d8 = local_3e4;
  }
  local_3e4 = iVar10;
  if ((int)QVar11 <= iVar10) {
    local_3e4 = QVar11;
  }
  local_3d4 = iVar2;
  if ((int)QVar17 <= iVar2) {
    local_3d4 = QVar17;
  }
  tcu::Surface::Surface(&viewportSurface,QVar11,QVar17);
  this_00 = local_3e0;
  messageLimitCounter = 8;
  if ((local_3e0->super_BBoxRenderCase).m_calcPerPrimitiveBBox == false) {
    local_1b0.m_log =
         ((local_3e0->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
         ->m_log;
    poVar1 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Projected bounding box: (clip space)\n");
    std::operator<<((ostream *)poVar1,"\tx: [");
    std::ostream::operator<<(poVar1,projectedBBox.min.m_data[0]);
    std::operator<<((ostream *)poVar1,",");
    std::ostream::operator<<(poVar1,projectedBBox.max.m_data[0]);
    std::operator<<((ostream *)poVar1,"]\n");
    std::operator<<((ostream *)poVar1,"\ty: [");
    std::ostream::operator<<(poVar1,projectedBBox.min.m_data[1]);
    std::operator<<((ostream *)poVar1,",");
    std::ostream::operator<<(poVar1,projectedBBox.max.m_data[1]);
    std::operator<<((ostream *)poVar1,"]\n");
    std::operator<<((ostream *)poVar1,"\tz: [");
    std::ostream::operator<<(poVar1,projectedBBox.min.m_data[2]);
    std::operator<<((ostream *)poVar1,",");
    std::ostream::operator<<(poVar1,projectedBBox.max.m_data[2]);
    std::operator<<((ostream *)poVar1,"]\n");
    std::operator<<((ostream *)poVar1,"In viewport coordinates:\n");
    std::operator<<((ostream *)poVar1,"\tx: [");
    std::ostream::operator<<(poVar1,viewportBBoxArea.m_data[0]);
    std::operator<<((ostream *)poVar1,", ");
    std::ostream::operator<<(poVar1,viewportBBoxArea.m_data[2]);
    std::operator<<((ostream *)poVar1,"]\n");
    std::operator<<((ostream *)poVar1,"\ty: [");
    std::ostream::operator<<(poVar1,viewportBBoxArea.m_data[1]);
    std::operator<<((ostream *)poVar1,", ");
    std::ostream::operator<<(poVar1,viewportBBoxArea.m_data[3]);
    std::operator<<((ostream *)poVar1,"]\n");
    std::operator<<((ostream *)poVar1,"Verifying render results within the bounding box:\n");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_1b0.m_log =
         ((local_3e0->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
         ->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
    std::operator<<((ostream *)&local_1b0.m_str,"Verifying render result:");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
  local_1b0.m_log =
       ((this_00->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  poVar1 = &local_1b0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,
                  "\tCalculating number of horizontal and vertical lines within the bounding box, expecting:\n"
                 );
  std::operator<<((ostream *)poVar1,"\t[");
  std::ostream::operator<<(poVar1,expectedHorizontalLines.m_data[0]);
  std::operator<<((ostream *)poVar1,", ");
  std::ostream::operator<<(poVar1,expectedHorizontalLines.m_data[1]);
  std::operator<<((ostream *)poVar1,"] horizontal lines.\n");
  std::operator<<((ostream *)poVar1,"\t[");
  std::ostream::operator<<(poVar1,expectedVerticalLines.m_data[0]);
  std::operator<<((ostream *)poVar1,", ");
  std::ostream::operator<<(poVar1,expectedVerticalLines.m_data[1]);
  std::operator<<((ostream *)poVar1,"] vertical lines.\n");
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  pTVar4 = (this_00->super_BBoxRenderCase).m_fbo.
           super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)3>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)3>_>_>
           .m_data.ptr;
  if (pTVar4 != (TypedObjectWrapper<(glu::ObjectType)3> *)0x0) {
    (**(code **)(local_390 + 0x78))(0x8ca8,(pTVar4->super_ObjectWrapper).m_object);
  }
  context = ((this_00->super_BBoxRenderCase).super_TestCase.m_context)->m_renderCtx;
  iVar10 = (local_3c8->viewportPos).m_data[0];
  iVar2 = (local_3c8->viewportPos).m_data[1];
  tcu::Surface::getAccess((PixelBufferAccess *)&local_1b0,&viewportSurface);
  glu::readPixels(context,iVar10,iVar2,(PixelBufferAccess *)&local_1b0);
  QVar17 = viewportPatternArea.m_data[1];
  if (viewportPatternArea.m_data[1] < (int)local_3d8) {
    QVar17 = local_3d8;
  }
  local_3d0 = local_3e4 - QVar15;
  local_3b8 = 0;
  local_3b0 = 0;
  local_398 = 0;
  local_3a0 = 0;
  local_3a8 = 0;
  local_390 = local_390 & 0xffffffff00000000;
  while( true ) {
    QVar11 = viewportPatternArea.m_data[3];
    if ((int)local_3d4 < viewportPatternArea.m_data[3]) {
      QVar11 = local_3d4;
    }
    if ((int)QVar11 <= (int)QVar17) break;
    tcu::Surface::getAccess((PixelBufferAccess *)&local_1b0,&viewportSurface);
    QVar11 = viewportPatternArea.m_data[0];
    if (viewportPatternArea.m_data[0] < (int)QVar15) {
      QVar11 = QVar15;
    }
    QVar5 = viewportPatternArea.m_data[2];
    if ((int)local_3e4 < viewportPatternArea.m_data[2]) {
      QVar5 = local_3e4;
    }
    local_268.m_name._M_string_length._0_4_ = local_3d0;
    local_268.m_name._M_string_length._4_4_ = 1;
    local_268.m_name._M_dataplus._M_p._0_4_ = QVar15;
    local_268.m_name._M_dataplus._M_p._4_4_ = QVar17;
    bVar7 = checkAreaNumLines(this_00,(ConstPixelBufferAccess *)&local_1b0,(IVec4 *)&local_268,
                              &messageLimitCounter,1,&expectedVerticalLines);
    local_3c8 = (IterationConfig *)CONCAT71(local_3c8._1_7_,bVar7);
    local_350[0]._M_allocated_capacity._0_4_ = local_3e4;
    local_350[0]._4_4_ = QVar17;
    local_268.m_name._M_dataplus._M_p._0_4_ = QVar15;
    local_268.m_name._M_dataplus._M_p._4_4_ = QVar17;
    bVar8 = checkLineWidths(this_00,(ConstPixelBufferAccess *)&local_1b0,(IVec2 *)&local_268,
                            (IVec2 *)&local_350[0]._M_allocated_capacity,1,&messageLimitCounter);
    local_350[0]._0_4_ = QVar5;
    local_350[0]._4_4_ = QVar17;
    local_268.m_name._M_dataplus._M_p._0_4_ = QVar11;
    local_268.m_name._M_dataplus._M_p._4_4_ = QVar17;
    bVar9 = checkLineContinuity(this_00,(ConstPixelBufferAccess *)&local_1b0,(IVec2 *)&local_268,
                                (IVec2 *)&local_350[0]._M_allocated_capacity,2,&messageLimitCounter)
    ;
    if (bVar9 == 0) {
      bVar9 = 0x10;
    }
    if (bVar8 == 0) {
      bVar8 = 2;
    }
    bVar9 = bVar8 | (byte)local_3c8 | bVar9;
    if ((bVar9 & 0x10) == 0) {
      if ((bVar9 & 0x40) == 0) {
        local_398 = local_398 + 1;
      }
      else {
        local_3a0 = local_3a0 + 1;
      }
    }
    else if ((bVar9 & 2) == 0) {
      if ((local_394 < 2) || (local_3e0->m_isWideLineCase == false)) {
        if ((bVar9 & 0xc) == 4) {
          local_3b8 = local_3b8 + 1;
        }
        else {
          local_3b0 = local_3b0 + 1;
        }
      }
      else {
        local_3a8 = local_3a8 + 1;
      }
    }
    local_390 = CONCAT44(local_390._4_4_,(int)local_390 + (~(uint)bVar9 & 1));
    QVar17 = QVar17 + DIRECTION_VERTICAL;
    this_00 = local_3e0;
  }
  QVar17 = viewportPatternArea.m_data[0];
  if (viewportPatternArea.m_data[0] < (int)QVar15) {
    QVar17 = QVar15;
  }
  local_3d0 = local_3d4 - local_3d8;
  iVar10 = 0;
  local_3ac = 0;
  local_3bc = 0;
  local_3b4 = 0;
  local_39c = 0;
  local_3a4 = 0;
  while( true ) {
    iVar2 = messageLimitCounter;
    __n = (size_t)local_3e4;
    QVar11 = viewportPatternArea.m_data[2];
    if ((int)local_3e4 < viewportPatternArea.m_data[2]) {
      QVar11 = local_3e4;
    }
    if ((int)QVar11 <= (int)QVar17) break;
    tcu::Surface::getAccess((PixelBufferAccess *)&local_1b0,&viewportSurface);
    QVar11 = viewportPatternArea.m_data[1];
    if ((int)local_3d8 < viewportPatternArea.m_data[1]) {
      QVar11 = local_3d8;
    }
    QVar15 = viewportPatternArea.m_data[3];
    if ((int)local_3d4 < viewportPatternArea.m_data[3]) {
      QVar15 = local_3d4;
    }
    local_268.m_name._M_dataplus._M_p._4_4_ = local_3d8;
    local_268.m_name._M_string_length._0_4_ = 1;
    local_268.m_name._M_string_length._4_4_ = local_3d0;
    local_268.m_name._M_dataplus._M_p._0_4_ = QVar17;
    bVar7 = checkAreaNumLines(this_00,(ConstPixelBufferAccess *)&local_1b0,(IVec4 *)&local_268,
                              &messageLimitCounter,2,&expectedHorizontalLines);
    local_3c8 = (IterationConfig *)CONCAT71(local_3c8._1_7_,bVar7);
    local_268.m_name._M_dataplus._M_p._4_4_ = local_3d8;
    local_350[0]._M_allocated_capacity._4_4_ = local_3d4;
    local_350[0]._0_4_ = QVar17;
    local_268.m_name._M_dataplus._M_p._0_4_ = QVar17;
    bVar8 = checkLineWidths(this_00,(ConstPixelBufferAccess *)&local_1b0,(IVec2 *)&local_268,
                            (IVec2 *)&local_350[0]._M_allocated_capacity,2,&messageLimitCounter);
    local_350[0]._0_4_ = QVar17;
    local_350[0]._4_4_ = QVar15;
    local_268.m_name._M_dataplus._M_p._0_4_ = QVar17;
    local_268.m_name._M_dataplus._M_p._4_4_ = QVar11;
    bVar9 = checkLineContinuity(this_00,(ConstPixelBufferAccess *)&local_1b0,(IVec2 *)&local_268,
                                (IVec2 *)&local_350[0]._M_allocated_capacity,1,&messageLimitCounter)
    ;
    if (bVar9 == 0) {
      bVar9 = 0x10;
    }
    if (bVar8 == 0) {
      bVar8 = 2;
    }
    bVar9 = bVar8 | (byte)local_3c8 | bVar9;
    if ((bVar9 & 0x10) == 0) {
      if ((bVar9 & 0x40) == 0) {
        local_39c = local_39c + 1;
      }
      else {
        local_3a4 = local_3a4 + 1;
      }
    }
    else if ((bVar9 & 2) == 0) {
      if ((local_394 < 2) || (local_3e0->m_isWideLineCase == false)) {
        if ((bVar9 & 0xc) == 4) {
          local_3bc = local_3bc + 1;
        }
        else {
          local_3b4 = local_3b4 + 1;
        }
      }
      else {
        local_3ac = local_3ac + 1;
      }
    }
    iVar10 = iVar10 + (~(uint)bVar9 & 1);
    QVar17 = QVar17 + DIRECTION_VERTICAL;
    this_00 = local_3e0;
  }
  bVar7 = true;
  if ((local_3b4 == 0 && local_3b0 == 0) && (local_39c == 0 && local_398 == 0)) {
    if (local_3ac == 0 && local_3a8 == 0) {
      if (local_3bc == 0 && local_3b8 == 0) {
        iVar3 = local_3a0;
        if ((iVar10 == 0) && (iVar3 = local_3a4, (int)local_390 == 0)) {
          bVar7 = false;
          qVar18 = QP_TEST_RESULT_PASS;
        }
        else {
          bVar7 = iVar3 == 0;
          qVar18 = (qpTestResult)!bVar7;
        }
        if (!bVar7 && (char)qVar18 == '\0') {
          local_1b0.m_log =
               ((local_3e0->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx)->m_log;
          poVar1 = &local_1b0.m_str;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
          std::operator<<((ostream *)poVar1,"Result image ok.");
          pTVar13 = tcu::MessageBuilder::operator<<
                              (&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_288,"Images",&local_3e5);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2a8,"Image verification",&local_3e6);
          tcu::LogImageSet::LogImageSet((LogImageSet *)local_350,&local_288,&local_2a8);
          tcu::LogImageSet::write((LogImageSet *)local_350,(int)pTVar13,__buf_01,__n);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2c8,"Viewport",&local_3e7);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_2e8,"Viewport contents",&local_3e8);
          tcu::Surface::getAccess((PixelBufferAccess *)&local_1d8,&viewportSurface);
          pCVar14 = &local_1d8;
          tcu::LogImage::LogImage
                    (&local_268,&local_2c8,&local_2e8,pCVar14,QP_IMAGE_COMPRESSION_MODE_BEST);
          tcu::LogImage::write(&local_268,(int)pTVar13,__buf_02,(size_t)pCVar14);
          tcu::TestLog::endImageSet(pTVar13);
          tcu::LogImage::~LogImage(&local_268);
          std::__cxx11::string::~string((string *)&local_2e8);
          std::__cxx11::string::~string((string *)&local_2c8);
          tcu::LogImageSet::~LogImageSet((LogImageSet *)local_350);
          std::__cxx11::string::~string((string *)&local_2a8);
          std::__cxx11::string::~string((string *)&local_288);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
          goto LAB_0059a507;
        }
        goto LAB_0059a2d5;
      }
      qVar18 = QP_TEST_RESULT_FAIL;
    }
    else {
      qVar18 = QP_TEST_RESULT_PASS;
    }
    bVar7 = false;
  }
  else {
    qVar18 = QP_TEST_RESULT_PASS;
  }
LAB_0059a2d5:
  if (messageLimitCounter < 0) {
    local_1b0.m_log =
         ((local_3e0->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
         ->m_log;
    poVar1 = &local_1b0.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Omitted ");
    std::ostream::operator<<(poVar1,-iVar2);
    std::operator<<((ostream *)poVar1," row/column error descriptions.");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  local_1b0.m_log =
       ((local_3e0->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
       m_log;
  poVar1 = &local_1b0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Image verification failed.");
  pTVar13 = tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"Images",&local_3e5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2a8,"Image verification",&local_3e6);
  tcu::LogImageSet::LogImageSet((LogImageSet *)local_350,&local_288,&local_2a8);
  tcu::LogImageSet::write((LogImageSet *)local_350,(int)pTVar13,__buf,__n);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c8,"Viewport",&local_3e7);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2e8,"Viewport contents",&local_3e8);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_1d8,&viewportSurface);
  pCVar14 = &local_1d8;
  tcu::LogImage::LogImage(&local_268,&local_2c8,&local_2e8,pCVar14,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write(&local_268,(int)pTVar13,__buf_00,(size_t)pCVar14);
  tcu::TestLog::endImageSet(pTVar13);
  tcu::LogImage::~LogImage(&local_268);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_2c8);
  tcu::LogImageSet::~LogImageSet((LogImageSet *)local_350);
  std::__cxx11::string::~string((string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_288);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  testResult = qVar18 ^ QP_TEST_RESULT_COMPATIBILITY_WARNING;
  pcVar16 = "Multisampled wide line verification failed";
  if ((char)qVar18 != '\0') {
    pcVar16 = "Line width verification failed";
  }
  if (bVar7) {
    testResult = QP_TEST_RESULT_FAIL;
  }
  description = "Image verification failed";
  if (!bVar7) {
    description = pcVar16;
  }
  tcu::TestContext::setTestResult
            ((local_3e0->super_BBoxRenderCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx,testResult,description);
LAB_0059a507:
  tcu::Surface::~Surface(&viewportSurface);
  return;
}

Assistant:

void LineRenderCase::verifyRenderResult (const IterationConfig& config)
{
	const glw::Functions&	gl							= m_context.getRenderContext().getFunctions();
	const bool				isMsaa						= m_context.getRenderTarget().getNumSamples() > 1;
	const ProjectedBBox		projectedBBox				= projectBoundingBox(config.bbox);
	const float				lineWidth					= (m_isWideLineCase) ? ((float)m_wideLineLineWidth) : (1.0f);
	const tcu::IVec4		viewportBBoxArea			= getViewportBoundingBoxArea(projectedBBox, config.viewportSize, lineWidth);
	const tcu::IVec4		viewportPatternArea			= getViewportPatternArea(config.patternPos, config.patternSize, config.viewportSize, ROUND_INWARDS);
	const tcu::IVec2		expectedHorizontalLines		= getNumberOfLinesRange(viewportBBoxArea.y(), viewportBBoxArea.w(), config.patternPos.y(), config.patternSize.y(), config.viewportSize.y(), DIRECTION_VERTICAL);
	const tcu::IVec2		expectedVerticalLines		= getNumberOfLinesRange(viewportBBoxArea.x(), viewportBBoxArea.z(), config.patternPos.x(), config.patternSize.x(), config.viewportSize.x(), DIRECTION_HORIZONTAL);
	const tcu::IVec4		verificationArea			= tcu::IVec4(de::max(viewportBBoxArea.x(), 0),
																	 de::max(viewportBBoxArea.y(), 0),
																	 de::min(viewportBBoxArea.z(), config.viewportSize.x()),
																	 de::min(viewportBBoxArea.w(), config.viewportSize.y()));

	tcu::Surface			viewportSurface				(config.viewportSize.x(), config.viewportSize.y());
	int						messageLimitCounter			= 8;

	enum ScanResultCodes
	{
		SCANRESULT_NUM_LINES_ERR	= 0,
		SCANRESULT_LINE_WIDTH_MSAA	= 1,
		SCANRESULT_LINE_WIDTH_WARN	= 2,
		SCANRESULT_LINE_WIDTH_ERR	= 3,
		SCANRESULT_LINE_CONT_ERR	= 4,
		SCANRESULT_LINE_CONT_WARN	= 5,
		SCANRESULT_LINE_LAST
	};

	int						rowScanResult[SCANRESULT_LINE_LAST]		= {0, 0, 0, 0, 0, 0};
	int						columnScanResult[SCANRESULT_LINE_LAST]	= {0, 0, 0, 0, 0, 0};
	bool					anyError								= false;
	bool					msaaRelaxationRequired					= false;
	bool					hwIssueRelaxationRequired				= false;

	if (!m_calcPerPrimitiveBBox)
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Projected bounding box: (clip space)\n"
				<< "\tx: [" << projectedBBox.min.x() << "," << projectedBBox.max.x() << "]\n"
				<< "\ty: [" << projectedBBox.min.y() << "," << projectedBBox.max.y() << "]\n"
				<< "\tz: [" << projectedBBox.min.z() << "," << projectedBBox.max.z() << "]\n"
			<< "In viewport coordinates:\n"
				<< "\tx: [" << viewportBBoxArea.x() << ", " << viewportBBoxArea.z() << "]\n"
				<< "\ty: [" << viewportBBoxArea.y() << ", " << viewportBBoxArea.w() << "]\n"
			<< "Verifying render results within the bounding box:\n"
			<< tcu::TestLog::EndMessage;
	else
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Verifying render result:"
			<< tcu::TestLog::EndMessage;

	m_testCtx.getLog()
		<< tcu::TestLog::Message
			<< "\tCalculating number of horizontal and vertical lines within the bounding box, expecting:\n"
			<< "\t[" << expectedHorizontalLines.x() << ", " << expectedHorizontalLines.y() << "] horizontal lines.\n"
			<< "\t[" << expectedVerticalLines.x() << ", " << expectedVerticalLines.y() << "] vertical lines.\n"
		<< tcu::TestLog::EndMessage;

	if (m_fbo)
		gl.bindFramebuffer(GL_READ_FRAMEBUFFER, **m_fbo);
	glu::readPixels(m_context.getRenderContext(), config.viewportPos.x(), config.viewportPos.y(), viewportSurface.getAccess());

	// scan rows
	for (int y = de::max(verificationArea.y(), viewportPatternArea.y()); y < de::min(verificationArea.w(), viewportPatternArea.w()); ++y)
	{
		const deUint8 result = scanRow(viewportSurface.getAccess(),
									   y,
									   verificationArea.x(),
									   verificationArea.z(),
									   de::max(verificationArea.x(), viewportPatternArea.x()),
									   de::min(verificationArea.z(), viewportPatternArea.z()),
									   expectedVerticalLines,
									   messageLimitCounter);

		if ((result & SCANRESULT_NUM_LINES_OK_BIT) == 0)
			rowScanResult[SCANRESULT_NUM_LINES_ERR]++;
		if ((result & SCANRESULT_LINE_CONT_OK_BIT) == 0)
		{
			if ((result & SCANRESULT_LINE_CONT_WARN_BIT) != 0)
				rowScanResult[SCANRESULT_LINE_CONT_WARN]++;
			else
				rowScanResult[SCANRESULT_LINE_CONT_ERR]++;
		}
		else if ((result & SCANRESULT_LINE_WIDTH_OK_BIT) == 0)
		{
			if (m_isWideLineCase && isMsaa)
			{
				// multisampled wide lines might not be supported
				rowScanResult[SCANRESULT_LINE_WIDTH_MSAA]++;
			}
			else if ((result & SCANRESULT_LINE_WIDTH_ERR_BIT) == 0 &&
					 (result & SCANRESULT_LINE_WIDTH_WARN_BIT) != 0)
			{
				rowScanResult[SCANRESULT_LINE_WIDTH_WARN]++;
			}
			else
				rowScanResult[SCANRESULT_LINE_WIDTH_ERR]++;
		}
	}

	// scan columns
	for (int x = de::max(verificationArea.x(), viewportPatternArea.x()); x < de::min(verificationArea.z(), viewportPatternArea.z()); ++x)
	{
		const deUint8 result = scanColumn(viewportSurface.getAccess(),
										  x,
										  verificationArea.y(),
										  verificationArea.w(),
										  de::min(verificationArea.y(), viewportPatternArea.y()),
										  de::min(verificationArea.w(), viewportPatternArea.w()),
										  expectedHorizontalLines,
										  messageLimitCounter);

		if ((result & SCANRESULT_NUM_LINES_OK_BIT) == 0)
			columnScanResult[SCANRESULT_NUM_LINES_ERR]++;
		if ((result & SCANRESULT_LINE_CONT_OK_BIT) == 0)
		{
			if ((result & SCANRESULT_LINE_CONT_WARN_BIT) != 0)
				columnScanResult[SCANRESULT_LINE_CONT_WARN]++;
			else
				columnScanResult[SCANRESULT_LINE_CONT_ERR]++;
		}
		else if ((result & SCANRESULT_LINE_WIDTH_OK_BIT) == 0)
		{
			if (m_isWideLineCase && isMsaa)
			{
				// multisampled wide lines might not be supported
				columnScanResult[SCANRESULT_LINE_WIDTH_MSAA]++;
			}
			else if ((result & SCANRESULT_LINE_WIDTH_ERR_BIT) == 0 &&
					 (result & SCANRESULT_LINE_WIDTH_WARN_BIT) != 0)
			{
				columnScanResult[SCANRESULT_LINE_WIDTH_WARN]++;
			}
			else
				columnScanResult[SCANRESULT_LINE_WIDTH_ERR]++;
		}
	}

	if (columnScanResult[SCANRESULT_LINE_WIDTH_ERR] != 0 || rowScanResult[SCANRESULT_LINE_WIDTH_ERR] != 0)
		anyError = true;
	else if(columnScanResult[SCANRESULT_LINE_CONT_ERR] != 0 || rowScanResult[SCANRESULT_LINE_CONT_ERR] != 0)
		anyError = true;
	else if (columnScanResult[SCANRESULT_LINE_WIDTH_MSAA] != 0 || rowScanResult[SCANRESULT_LINE_WIDTH_MSAA] != 0)
		msaaRelaxationRequired = true;
	else if (columnScanResult[SCANRESULT_LINE_WIDTH_WARN] != 0 || rowScanResult[SCANRESULT_LINE_WIDTH_WARN] != 0)
		hwIssueRelaxationRequired = true;
	else if (columnScanResult[SCANRESULT_NUM_LINES_ERR] != 0)
	{
		// found missing lines in a columnw and row line continuity check reported a warning (not an error) -> line width precision issue
		if (rowScanResult[SCANRESULT_LINE_CONT_ERR] == 0 && rowScanResult[SCANRESULT_LINE_CONT_WARN])
			hwIssueRelaxationRequired = true;
		else
			anyError = true;
	}
	else if (rowScanResult[SCANRESULT_NUM_LINES_ERR] != 0)
	{
		// found missing lines in a row and column line continuity check reported a warning (not an error) -> line width precision issue
		if (columnScanResult[SCANRESULT_LINE_CONT_ERR] == 0 && columnScanResult[SCANRESULT_LINE_CONT_WARN])
			hwIssueRelaxationRequired = true;
		else
			anyError = true;
	}

	if (anyError || msaaRelaxationRequired || hwIssueRelaxationRequired)
	{
		if (messageLimitCounter < 0)
			m_testCtx.getLog() << tcu::TestLog::Message << "Omitted " << (-messageLimitCounter) << " row/column error descriptions." << tcu::TestLog::EndMessage;

		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Image verification failed."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Images", "Image verification")
			<< tcu::TestLog::Image("Viewport", "Viewport contents", viewportSurface.getAccess())
			<< tcu::TestLog::EndImageSet;

		if (anyError)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
		else if (hwIssueRelaxationRequired)
		{
			// Line width hw issue
			m_testCtx.setTestResult(QP_TEST_RESULT_QUALITY_WARNING, "Line width verification failed");
		}
		else
		{
			// MSAA wide lines are optional
			m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, "Multisampled wide line verification failed");
		}
	}
	else
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Result image ok."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Images", "Image verification")
			<< tcu::TestLog::Image("Viewport", "Viewport contents", viewportSurface.getAccess())
			<< tcu::TestLog::EndImageSet;
	}
}